

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

bool SparseKeyTest<1024,Blob<256>>
               (hashfunc<Blob<256>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  Blob<256> h;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> local_f8;
  value_type local_d8;
  undefined1 local_b8 [136];
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x400,pcVar2,(ulong)(uint)setbits)
  ;
  local_f8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._0_64_ = ZEXT464(0) << 0x40;
  local_b8._64_64_ = local_b8._0_64_;
  if (iVar3 != 0) {
    local_d8.bytes = (uint8_t  [32])(ZEXT432(0) << 0x20);
    (*hash.m_hash)(local_b8,0x80,0,&local_d8);
    std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back(&local_f8,&local_d8);
  }
  SparseKeygenRecurse<Blob<1024>,Blob<256>>
            (hash.m_hash,0,setbits,inclusive,(Blob<1024> *)local_b8,&local_f8);
  printf("%d keys\n",
         (ulong)((long)local_f8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)local_f8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 5);
  bVar1 = TestHashList<Blob<256>>(&local_f8,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  if (local_f8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}